

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ConstantPaddingLayerParams::SerializeWithCachedSizes
          (ConstantPaddingLayerParams *this,CodedOutputStream *output)

{
  float value;
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  unsigned_long *puVar4;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  ulong value_00;
  ulong uVar8;
  int index;
  uint value_01;
  
  value = this->value_;
  if ((value != 0.0) || (NAN(value))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(1,value,output);
  }
  if (0 < (this->padamounts_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x12);
      iVar3 = output->buffer_size_;
    }
    else {
      *output->buffer_ = '\x12';
      output->buffer_ = output->buffer_ + 1;
      iVar3 = output->buffer_size_ + -1;
      output->buffer_size_ = iVar3;
    }
    value_01 = this->_padamounts_cached_byte_size_;
    if (iVar3 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,value_01);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar6 = pbVar1;
      uVar7 = value_01;
      if (0x7f < value_01) {
        do {
          *pbVar6 = (byte)value_01 | 0x80;
          uVar7 = value_01 >> 7;
          pbVar6 = pbVar6 + 1;
          bVar2 = 0x3fff < value_01;
          value_01 = uVar7;
        } while (bVar2);
      }
      *pbVar6 = (byte)uVar7;
      iVar3 = ((int)pbVar6 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar3;
      output->buffer_size_ = output->buffer_size_ - iVar3;
    }
    iVar3 = (this->padamounts_).current_size_;
    if (0 < iVar3) {
      index = 0;
      do {
        puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->padamounts_,index);
        value_00 = *puVar4;
        if (output->buffer_size_ < 10) {
          google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,value_00);
        }
        else {
          pbVar1 = output->buffer_;
          pbVar6 = pbVar1;
          uVar8 = value_00;
          if (0x7f < value_00) {
            do {
              *pbVar6 = (byte)value_00 | 0x80;
              uVar8 = value_00 >> 7;
              pbVar6 = pbVar6 + 1;
              bVar2 = 0x3fff < value_00;
              value_00 = uVar8;
            } while (bVar2);
          }
          *pbVar6 = (byte)uVar8;
          iVar5 = ((int)pbVar6 - (int)pbVar1) + 1;
          output->buffer_ = output->buffer_ + iVar5;
          output->buffer_size_ = output->buffer_size_ - iVar5;
        }
        index = index + 1;
      } while (index != iVar3);
    }
  }
  if (this->padtogivenoutputsizemode_ == false) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteBool(3,true,output);
  return;
}

Assistant:

void ConstantPaddingLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ConstantPaddingLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // float value = 1;
  if (this->value() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(1, this->value(), output);
  }

  // repeated uint64 padAmounts = 2;
  if (this->padamounts_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_padamounts_cached_byte_size_);
  }
  for (int i = 0, n = this->padamounts_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->padamounts(i), output);
  }

  // bool padToGivenOutputSizeMode = 3;
  if (this->padtogivenoutputsizemode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->padtogivenoutputsizemode(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ConstantPaddingLayerParams)
}